

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5b71b7::CoalesceProvider::provideStreamData
          (CoalesceProvider *this,QPDFObjGen *param_1,Pipeline *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  long *plVar3;
  size_type *psVar4;
  string all_description;
  string description;
  string local_68;
  string local_48;
  QPDFObjGen local_28;
  
  peVar2 = (this->containing_page).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_28.obj = 0;
    local_28.gen = 0;
  }
  else {
    local_28 = peVar2->og;
  }
  QPDFObjGen::unparse_abi_cxx11_(&local_68,&local_28,' ');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x27aa91);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48.field_2._8_8_ = plVar3[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_48._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  QPDFObjectHandle::pipeContentStreams(&this->old_contents,p,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
CoalesceProvider::provideStreamData(QPDFObjGen const&, Pipeline* p)
{
    QTC::TC("qpdf", "QPDFObjectHandle coalesce provide stream data");
    std::string description = "page object " + containing_page.getObjGen().unparse(' ');
    std::string all_description;
    old_contents.pipeContentStreams(p, description, all_description);
}